

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void DoStreamSummary(SstStream Stream)

{
  SstStream in_RDI;
  char OutputString [256];
  int i;
  SstStats AllStats;
  SMPI_Datatype in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  void *in_stack_fffffffffffffef0;
  SMPI_Datatype in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  void *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff10;
  SMPI_Comm in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  int local_14;
  void *local_10;
  
  local_10 = (void *)0x0;
  if (in_RDI->Rank == 0) {
    local_10 = malloc((long)in_RDI->CohortSize * 0x60);
  }
  SMPI_Gather(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
              in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
              in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  if (in_RDI->Rank == 0) {
    for (local_14 = 1; local_14 < in_RDI->CohortSize; local_14 = local_14 + 1) {
      *(long *)((long)local_10 + 0x30) =
           *(long *)((long)local_10 + (long)local_14 * 0x60 + 0x30) +
           *(long *)((long)local_10 + 0x30);
      *(long *)((long)local_10 + 0x38) =
           *(long *)((long)local_10 + (long)local_14 * 0x60 + 0x38) +
           *(long *)((long)local_10 + 0x38);
      *(long *)((long)local_10 + 0x40) =
           *(long *)((long)local_10 + (long)local_14 * 0x60 + 0x40) +
           *(long *)((long)local_10 + 0x40);
      *(double *)((long)local_10 + 0x58) =
           *(double *)((long)local_10 + (long)local_14 * 0x60 + 0x58) +
           *(double *)((long)local_10 + 0x58);
    }
    *(double *)((long)local_10 + 0x58) =
         *(double *)((long)local_10 + 0x58) / (double)in_RDI->CohortSize;
    CP_verbose(in_RDI,SummaryVerbose,"\nStream \"%s\" (%p) summary info:\n",in_RDI->Filename,in_RDI)
    ;
    CP_verbose((SstStream)(in_RDI->Stats).StreamValidTimeSecs,(VerbosityLevel)in_RDI,(char *)0x2,
               "\tDuration (secs) = %g\n");
    if (in_RDI->Role == WriterRole) {
      CP_verbose(in_RDI,SummaryVerbose,"\tTimesteps Created = %zu\n",
                 (in_RDI->Stats).TimestepsCreated);
      CP_verbose(in_RDI,SummaryVerbose,"\tTimesteps Delivered = %zu\n",
                 (in_RDI->Stats).TimestepsDelivered);
    }
    else if (in_RDI->Role == ReaderRole) {
      CP_verbose(in_RDI,SummaryVerbose,"\tTimestep Metadata Received = %zu\n",
                 (in_RDI->Stats).TimestepMetadataReceived);
      CP_verbose(in_RDI,SummaryVerbose,"\tTimesteps Consumed = %zu\n",
                 (in_RDI->Stats).TimestepsConsumed);
      ReadableSizeString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30);
      CP_verbose(in_RDI,SummaryVerbose,"\tMetadataBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)local_10 + 0x30),&stack0xfffffffffffffee8);
      ReadableSizeString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30);
      CP_verbose(in_RDI,SummaryVerbose,"\tDataBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)local_10 + 0x38),&stack0xfffffffffffffee8);
      ReadableSizeString(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         in_stack_ffffffffffffff30);
      CP_verbose(in_RDI,SummaryVerbose,"\tPreloadBytesReceived = %zu (%s)\n",
                 *(undefined8 *)((long)local_10 + 0x40),&stack0xfffffffffffffee8);
      CP_verbose(in_RDI,SummaryVerbose,"\tPreloadTimestepsReceived = %zu\n",
                 (in_RDI->Stats).PreloadTimestepsReceived);
      CP_verbose(*(SstStream *)((long)local_10 + 0x58),(VerbosityLevel)in_RDI,(char *)0x2,
                 "\tAverageReadRankFanIn = %.1f\n");
    }
    CP_verbose(in_RDI,SummaryVerbose,"\n");
    free(local_10);
  }
  return;
}

Assistant:

extern void DoStreamSummary(SstStream Stream)
{
    SstStats AllStats = NULL;

    if (Stream->Rank == 0)
        AllStats = malloc(sizeof(struct _SstStats) * Stream->CohortSize);

    SMPI_Gather(&Stream->Stats, sizeof(struct _SstStats), SMPI_CHAR, AllStats,
                sizeof(struct _SstStats), SMPI_CHAR, 0, Stream->mpiComm);

    if (Stream->Rank != 0)
    {
        return;
    }

    for (int i = 1; i < Stream->CohortSize; i++)
    {
        AllStats[0].MetadataBytesReceived += AllStats[i].MetadataBytesReceived;
        AllStats[0].DataBytesReceived += AllStats[i].DataBytesReceived;
        AllStats[0].PreloadBytesReceived += AllStats[i].PreloadBytesReceived;
        AllStats[0].RunningFanIn += AllStats[i].RunningFanIn;
    }
    AllStats[0].RunningFanIn /= Stream->CohortSize;

    CP_verbose(Stream, SummaryVerbose, "\nStream \"%s\" (%p) summary info:\n", Stream->Filename,
               (void *)Stream);
    CP_verbose(Stream, SummaryVerbose, "\tDuration (secs) = %g\n",
               Stream->Stats.StreamValidTimeSecs);
    if (Stream->Role == WriterRole)
    {
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Created = %zu\n",
                   Stream->Stats.TimestepsCreated);
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Delivered = %zu\n",
                   Stream->Stats.TimestepsDelivered);
    }
    else if (Stream->Role == ReaderRole)
    {
        char OutputString[256];
        CP_verbose(Stream, SummaryVerbose, "\tTimestep Metadata Received = %zu\n",
                   Stream->Stats.TimestepMetadataReceived);
        CP_verbose(Stream, SummaryVerbose, "\tTimesteps Consumed = %zu\n",
                   Stream->Stats.TimestepsConsumed);
        ReadableSizeString(AllStats[0].MetadataBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tMetadataBytesReceived = %zu (%s)\n",
                   AllStats[0].MetadataBytesReceived, OutputString);
        ReadableSizeString(AllStats[0].DataBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tDataBytesReceived = %zu (%s)\n",
                   AllStats[0].DataBytesReceived, OutputString);
        ReadableSizeString(AllStats[0].PreloadBytesReceived, OutputString, sizeof(OutputString));
        CP_verbose(Stream, SummaryVerbose, "\tPreloadBytesReceived = %zu (%s)\n",
                   AllStats[0].PreloadBytesReceived, OutputString);
        CP_verbose(Stream, SummaryVerbose, "\tPreloadTimestepsReceived = %zu\n",
                   Stream->Stats.PreloadTimestepsReceived);
        CP_verbose(Stream, SummaryVerbose, "\tAverageReadRankFanIn = %.1f\n",
                   AllStats[0].RunningFanIn);
    }
    CP_verbose(Stream, SummaryVerbose, "\n");
    free(AllStats);
}